

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeNF
          (ChElementShellANCF_3833 *this,double xi,double eta,double zeta,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  XprTypeNested pMVar7;
  scalar_constant_op<double> sVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  long index;
  uint i;
  long index_00;
  Scalar SVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChVectorN<double,_3> M_scaled;
  ChMatrix33<double> J_Cxi_Inv;
  Map<Eigen::Matrix<double,_72,_1,_0,_72,_1>,_0,_Eigen::Stride<0,_0>_> QiReshaped;
  ChMatrix33<double> J_Cxi;
  VectorN G_C;
  VectorN G_B;
  VectorN G_A;
  MatrixNx3c Sxi_D;
  VectorN Sxi_compact;
  Matrix3xN e_bar;
  MatrixNx3 QiCompact;
  undefined1 local_eb0 [16];
  XprTypeNested pMStack_ea0;
  variable_if_dynamic<long,__1> vStack_e98;
  variable_if_dynamic<long,__1> vStack_e90;
  long lStack_e88;
  XprTypeNested pMStack_e80;
  scalar_constant_op<double> local_e78;
  Matrix<double,_3,_3,_1,_3,_3> local_e68;
  BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true> local_e20;
  BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true> local_de0;
  BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true> local_da0;
  BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true> local_d60;
  undefined1 local_d20 [16];
  XprTypeNested pMStack_d10;
  variable_if_dynamic<long,__1> vStack_d08;
  variable_if_dynamic<long,__1> vStack_d00;
  Index IStack_cf8;
  long lStack_cf0;
  undefined1 local_ce8 [16];
  XprTypeNested pMStack_cd8;
  variable_if_dynamic<long,__1> vStack_cd0;
  variable_if_dynamic<long,__1> vStack_cc8;
  long lStack_cc0;
  XprTypeNested pMStack_cb8;
  scalar_constant_op<double> local_cb0;
  BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true> local_ca0;
  Matrix<double,_24,_3,_1,_24,_3> *local_c70 [2];
  undefined1 local_c60 [16];
  XprTypeNested pMStack_c50;
  variable_if_dynamic<long,__1> vStack_c48;
  variable_if_dynamic<long,__1> vStack_c40;
  XprTypeNested pMStack_c38;
  scalar_constant_op<double> local_c28;
  undefined1 local_c18 [24];
  scalar_constant_op<double> sStack_c00;
  XprTypeNested local_bf8;
  variable_if_dynamic<long,__1> vStack_bf0;
  long lStack_be8;
  XprTypeNested pMStack_be0;
  double local_bd0;
  PointerType local_bc0;
  XprTypeNested pMStack_bb8;
  XprTypeNested pMStack_bb0;
  long lStack_ba8;
  long lStack_ba0;
  XprTypeNested pMStack_b98;
  double local_b88;
  PointerType local_b70;
  XprTypeNested pMStack_b68;
  XprTypeNested pMStack_b60;
  XprTypeNested pMStack_b58;
  long lStack_b50;
  XprTypeNested pMStack_b48;
  double local_b38;
  PointerType local_b20;
  PointerType pdStack_b18;
  XprTypeNested pMStack_b10;
  XprTypeNested pMStack_b08;
  long lStack_b00;
  Index IStack_af8;
  XprTypeNested pMStack_af0;
  Matrix<double,_3,_3,_1,_3,_3> local_ac8;
  undefined1 local_a80 [16];
  XprTypeNested pMStack_a70;
  variable_if_dynamic<long,__1> vStack_a68;
  variable_if_dynamic<long,__1> vStack_a60;
  XprTypeNested pMStack_a58;
  scalar_constant_op<double> local_a48;
  undefined1 local_9c0 [16];
  XprTypeNested pMStack_9b0;
  variable_if_dynamic<long,__1> vStack_9a8;
  variable_if_dynamic<long,__1> vStack_9a0;
  XprTypeNested pMStack_998;
  scalar_constant_op<double> local_988;
  BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true> local_8f0;
  Matrix<double,_3,_3,_1,_3,_3> *local_8c0 [24];
  MatrixNx3c local_800;
  VectorN local_5c0;
  undefined1 local_500 [32];
  XprTypeNested local_4e0;
  variable_if_dynamic<long,__1> vStack_4d8;
  double dStack_4d0;
  double dStack_4c8;
  Matrix<double,_24,_3,_1,_24,_3> local_2c0;
  
  Calc_Sxi_compact(this,&local_5c0,xi,eta,zeta,this->m_thicknessZ,this->m_midsurfoffset);
  index = 0;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_800,F,0,3);
  local_500._0_8_ = &local_5c0;
  vStack_4d8.m_value =
       (long)local_800.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>.m_storage.
             m_data.array[4];
  dStack_4d0 = local_800.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>.m_storage.
               m_data.array[5];
  dStack_4c8 = local_800.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>.m_storage.
               m_data.array[6];
  local_500._8_8_ =
       local_800.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>.m_storage.m_data.
       array[0];
  local_500._16_8_ =
       local_800.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>.m_storage.m_data.
       array[1];
  local_500._24_8_ =
       local_800.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>.m_storage.m_data.
       array[2];
  local_4e0 = (XprTypeNested)
              local_800.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>.m_storage.
              m_data.array[3];
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,24,3,1,24,3>,Eigen::Product<Eigen::Matrix<double,24,1,0,24,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>>
            (&local_2c0,
             (Product<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
              *)local_500);
  local_c70[0] = &local_2c0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,72,1,0,72,1>,0,Eigen::Stride<0,0>>>
            (Qi,(Map<Eigen::Matrix<double,_72,_1,_0,_72,_1>,_0,_Eigen::Stride<0,_0>_> *)local_c70);
  CalcCoordMatrix(this,(Matrix3xN *)local_500);
  Calc_Sxi_D(this,&local_800,xi,eta,zeta,this->m_thicknessZ,this->m_midsurfoffset);
  local_c18._0_8_ =
       (Product<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
        *)local_500;
  local_c18._8_8_ = &local_800;
  local_8c0[0] = &local_ac8;
  Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_8c0,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_Eigen::Matrix<double,_24,_3,_0,_24,_3>,_0>_>
              *)local_c18);
  local_c18._0_8_ = &local_ac8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>>
            (&local_e68,(Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_c18);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true> *)
                  local_d20,&local_800,0);
  lStack_b00 = vStack_d00.m_value;
  IStack_af8 = IStack_cf8;
  local_b20 = (PointerType)local_d20._0_8_;
  pdStack_b18 = (PointerType)local_d20._8_8_;
  pMStack_b10 = pMStack_d10;
  pMStack_b08 = (XprTypeNested)vStack_d08.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>
             *)local_9c0,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>
             *)&local_b20,(double *)&local_e68);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true>::
  BlockImpl_dense(&local_da0,&local_800,1);
  local_d60.m_startCol.m_value = local_da0.m_startCol.m_value;
  local_d60.m_outerStride = local_da0.m_outerStride;
  local_d60.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data =
       local_da0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data;
  local_d60.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_ =
       local_da0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_;
  local_d60.m_xpr = local_da0.m_xpr;
  local_d60.m_startRow.m_value = local_da0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>
             *)local_a80,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>
             *)&local_d60,
            local_e68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 3);
  sVar8.m_other = local_a48.m_other;
  lStack_e88 = vStack_9a0.m_value;
  pMStack_e80 = pMStack_998;
  local_ce8._8_8_ = local_a80._0_8_;
  pMStack_cd8 = (XprTypeNested)local_a80._8_8_;
  local_eb0._8_8_ = local_9c0._0_8_;
  pMStack_ea0 = (XprTypeNested)local_9c0._8_8_;
  vStack_e98.m_value = (long)pMStack_9b0;
  vStack_e90.m_value = vStack_9a8.m_value;
  vStack_cd0.m_value = (long)pMStack_a70;
  vStack_cc8.m_value = vStack_a68.m_value;
  lStack_cc0 = vStack_a60.m_value;
  pMStack_cb8 = pMStack_a58;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true>::
  BlockImpl_dense(&local_e20,&local_800,2);
  local_de0.m_startCol.m_value = local_e20.m_startCol.m_value;
  local_de0.m_outerStride = local_e20.m_outerStride;
  local_de0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data =
       local_e20.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data;
  local_de0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_ =
       local_e20.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_;
  local_de0.m_xpr = local_e20.m_xpr;
  local_de0.m_startRow.m_value = local_e20.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>
             *)local_c60,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>
             *)&local_de0,
            local_e68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 6);
  lStack_be8 = lStack_e88;
  pMStack_be0 = pMStack_e80;
  local_c18._16_8_ = local_eb0._8_8_;
  sStack_c00.m_other = (double)pMStack_ea0;
  local_bf8 = (XprTypeNested)vStack_e98.m_value;
  vStack_bf0.m_value = vStack_e90.m_value;
  local_bd0 = local_988.m_other;
  local_bc0 = (PointerType)local_ce8._8_8_;
  pMStack_bb8 = pMStack_cd8;
  pMStack_bb0 = (XprTypeNested)vStack_cd0.m_value;
  lStack_ba8 = vStack_cc8.m_value;
  lStack_ba0 = lStack_cc0;
  pMStack_b98 = pMStack_cb8;
  local_b88 = sVar8.m_other;
  local_b70 = (PointerType)local_c60._0_8_;
  pMStack_b68 = (XprTypeNested)local_c60._8_8_;
  pMStack_b60 = pMStack_c50;
  pMStack_b58 = (XprTypeNested)vStack_c48.m_value;
  lStack_b50 = vStack_c40.m_value;
  pMStack_b48 = pMStack_c38;
  local_b38 = local_c28.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,24,1,0,24,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,24,1,1,24>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,24,1,1,24>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,24,1,1,24>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,24,1,0,24,1>> *)local_8c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>_>_>
              *)local_c18);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true>::
  BlockImpl_dense(&local_d60,&local_800,0);
  vStack_d00.m_value = local_d60.m_startCol.m_value;
  IStack_cf8 = local_d60.m_outerStride;
  local_d20._0_8_ =
       local_d60.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data;
  local_d20._8_8_ =
       local_d60.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_;
  pMStack_d10 = local_d60.m_xpr;
  vStack_d08.m_value = local_d60.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>
             *)local_a80,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>
             *)local_d20,
            local_e68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 1);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true>::
  BlockImpl_dense(&local_de0,&local_800,1);
  local_da0.m_startCol.m_value = local_de0.m_startCol.m_value;
  local_da0.m_outerStride = local_de0.m_outerStride;
  local_da0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data =
       local_de0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data;
  local_da0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_ =
       local_de0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_;
  local_da0.m_xpr = local_de0.m_xpr;
  local_da0.m_startRow.m_value = local_de0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>
             *)local_c60,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>
             *)&local_da0,
            local_e68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 4);
  sVar8.m_other = local_c28.m_other;
  lStack_cc0 = vStack_a60.m_value;
  pMStack_cb8 = pMStack_a58;
  pdStack_b18 = (PointerType)local_c60._0_8_;
  pMStack_b10 = (XprTypeNested)local_c60._8_8_;
  local_ce8._8_8_ = local_a80._0_8_;
  pMStack_cd8 = (XprTypeNested)local_a80._8_8_;
  vStack_cd0.m_value = (long)pMStack_a70;
  vStack_cc8.m_value = vStack_a68.m_value;
  pMStack_b08 = pMStack_c50;
  lStack_b00 = vStack_c48.m_value;
  IStack_af8 = vStack_c40.m_value;
  pMStack_af0 = pMStack_c38;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true>::
  BlockImpl_dense(&local_ca0,&local_800,2);
  local_e20.m_startCol.m_value = local_ca0.m_startCol.m_value;
  local_e20.m_outerStride = local_ca0.m_outerStride;
  local_e20.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data =
       local_ca0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data;
  local_e20.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_ =
       local_ca0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_;
  local_e20.m_xpr = local_ca0.m_xpr;
  local_e20.m_startRow.m_value = local_ca0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>
             *)local_eb0,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>
             *)&local_e20,
            local_e68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 7);
  lStack_be8 = lStack_cc0;
  pMStack_be0 = pMStack_cb8;
  local_c18._16_8_ = local_ce8._8_8_;
  sStack_c00.m_other = (double)pMStack_cd8;
  local_bf8 = (XprTypeNested)vStack_cd0.m_value;
  vStack_bf0.m_value = vStack_cc8.m_value;
  local_bd0 = local_a48.m_other;
  local_bc0 = pdStack_b18;
  pMStack_bb8 = pMStack_b10;
  pMStack_bb0 = pMStack_b08;
  lStack_ba8 = lStack_b00;
  lStack_ba0 = IStack_af8;
  pMStack_b98 = pMStack_af0;
  local_b88 = sVar8.m_other;
  local_b70 = (PointerType)local_eb0._0_8_;
  pMStack_b68 = (XprTypeNested)local_eb0._8_8_;
  pMStack_b60 = pMStack_ea0;
  pMStack_b58 = (XprTypeNested)vStack_e98.m_value;
  lStack_b50 = vStack_e90.m_value;
  pMStack_b48 = (XprTypeNested)lStack_e88;
  local_b38 = local_e78.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,24,1,0,24,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,24,1,1,24>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,24,1,1,24>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,24,1,1,24>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,24,1,0,24,1>> *)local_9c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>_>_>
              *)local_c18);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true>::
  BlockImpl_dense(&local_da0,&local_800,0);
  local_d60.m_startCol.m_value = local_da0.m_startCol.m_value;
  local_d60.m_outerStride = local_da0.m_outerStride;
  local_d60.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data =
       local_da0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data;
  local_d60.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_ =
       local_da0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_;
  local_d60.m_xpr = local_da0.m_xpr;
  local_d60.m_startRow.m_value = local_da0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>
             *)local_c60,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>
             *)&local_d60,
            local_e68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 2);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true>::
  BlockImpl_dense(&local_e20,&local_800,1);
  local_de0.m_startCol.m_value = local_e20.m_startCol.m_value;
  local_de0.m_outerStride = local_e20.m_outerStride;
  local_de0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data =
       local_e20.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data;
  local_de0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_ =
       local_e20.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_;
  local_de0.m_xpr = local_e20.m_xpr;
  local_de0.m_startRow.m_value = local_e20.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>
             *)local_eb0,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>
             *)&local_de0,
            local_e68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 5);
  IStack_af8 = vStack_c40.m_value;
  pMStack_af0 = pMStack_c38;
  local_d20._8_8_ = local_eb0._0_8_;
  pMStack_d10 = (XprTypeNested)local_eb0._8_8_;
  pdStack_b18 = (PointerType)local_c60._0_8_;
  pMStack_b10 = (XprTypeNested)local_c60._8_8_;
  pMStack_b08 = pMStack_c50;
  lStack_b00 = vStack_c48.m_value;
  vStack_d08.m_value = (long)pMStack_ea0;
  vStack_d00.m_value = vStack_e98.m_value;
  IStack_cf8 = vStack_e90.m_value;
  lStack_cf0 = lStack_e88;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true,_true>::
  BlockImpl_dense(&local_8f0,&local_800,2);
  local_ca0.m_startCol.m_value = local_8f0.m_startCol.m_value;
  local_ca0.m_outerStride = local_8f0.m_outerStride;
  local_ca0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data =
       local_8f0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>.m_data;
  local_ca0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_ =
       local_8f0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_1>
       .super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>,_0>._8_8_;
  local_ca0.m_xpr = local_8f0.m_xpr;
  local_ca0.m_startRow.m_value = local_8f0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>
             *)local_ce8,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>>
             *)&local_ca0,
            local_e68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 8);
  lStack_be8 = IStack_af8;
  pMStack_be0 = pMStack_af0;
  local_c18._16_8_ = pdStack_b18;
  sStack_c00.m_other = (double)pMStack_b10;
  local_bf8 = pMStack_b08;
  vStack_bf0.m_value = lStack_b00;
  local_bd0 = local_c28.m_other;
  local_bc0 = (PointerType)local_d20._8_8_;
  pMStack_bb8 = pMStack_d10;
  pMStack_bb0 = (XprTypeNested)vStack_d08.m_value;
  lStack_ba8 = vStack_d00.m_value;
  lStack_ba0 = IStack_cf8;
  pMStack_b98 = (XprTypeNested)lStack_cf0;
  local_b88 = local_e78.m_other;
  local_b70 = (PointerType)local_ce8._0_8_;
  pMStack_b68 = (XprTypeNested)local_ce8._8_8_;
  pMStack_b60 = pMStack_cd8;
  pMStack_b58 = (XprTypeNested)vStack_cd0.m_value;
  lStack_b50 = vStack_cc8.m_value;
  pMStack_b48 = (XprTypeNested)lStack_cc0;
  local_b38 = local_cb0.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,24,1,0,24,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,24,1,1,24>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,24,1,1,24>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,24,3,0,24,3>,24,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,24,1,1,24>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,24,1,0,24,1>> *)local_a80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_24,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>_>_>_>
              *)local_c18);
  local_ce8._0_8_ = (PointerType)0x3fe0000000000000;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c60,F,3,3);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)local_c18,(double *)local_ce8,(StorageBaseType *)local_c60);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_eb0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
              *)local_c18);
  for (index_00 = 0; uVar5 = local_eb0._8_8_, index_00 != 0x18; index_00 = index_00 + 1) {
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)local_a80,
                        index_00);
    pMVar7 = pMStack_ea0;
    SVar1 = *pSVar9;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)local_9c0,
                        index_00);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = SVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (double)pMVar7 * *pSVar9;
    auVar2 = vfmsub231sd_fma(auVar15,auVar12,auVar2);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index);
    pMVar7 = pMStack_ea0;
    *pSVar10 = auVar2._0_8_ + *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)local_8c0,
                        index_00);
    uVar5 = local_eb0._0_8_;
    SVar1 = *pSVar9;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)local_a80,
                        index_00);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pMVar7;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (double)uVar5 * *pSVar9;
    auVar2 = vfmsub231sd_fma(auVar16,auVar13,auVar3);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index + 1)
    ;
    uVar5 = local_eb0._0_8_;
    *pSVar10 = auVar2._0_8_ + *pSVar10;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)local_9c0,
                        index_00);
    uVar6 = local_eb0._8_8_;
    SVar1 = *pSVar9;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)local_8c0,
                        index_00);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = SVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar5;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (double)uVar6 * *pSVar9;
    auVar2 = vfmsub231sd_fma(auVar17,auVar14,auVar4);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index + 2)
    ;
    index = index + 3;
    *pSVar10 = auVar2._0_8_ + *pSVar10;
  }
  SVar11 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                     (&local_ac8);
  *detJ = SVar11;
  return;
}

Assistant:

void ChElementShellANCF_3833::ComputeNF(
    const double xi,             // parametric coordinate in volume
    const double eta,            // parametric coordinate in volume
    const double zeta,           // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // Compute the generalized force vector for the applied force component using the compact form of the shape
    // functions.  This requires a reshaping of the calculated matrix to get it into the correct vector order (just a
    // reinterpretation of the data since the matrix is in row-major format)
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta, m_thicknessZ, m_midsurfoffset);
    MatrixNx3 QiCompact;

    QiCompact = Sxi_compact * F.segment(0, 3).transpose();

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Qi = QiReshaped;

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    MatrixNx3c Sxi_D;
    Calc_Sxi_D(Sxi_D, xi, eta, zeta, m_thicknessZ, m_midsurfoffset);

    ChMatrix33<double> J_Cxi;
    ChMatrix33<double> J_Cxi_Inv;

    J_Cxi.noalias() = e_bar * Sxi_D;
    J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi((3 * i) + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi((3 * i) + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential volume and the normalized differential volume.  The determinate of the element Jacobian is
    //  used to calculate this volume ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.determinant();
}